

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkMemUtil.cpp
# Opt level: O0

void vk::flushMappedMemoryRange
               (DeviceInterface *vkd,VkDevice device,VkDeviceMemory memory,VkDeviceSize offset,
               VkDeviceSize size)

{
  VkResult result;
  undefined4 local_58 [2];
  VkMappedMemoryRange range;
  VkDeviceSize size_local;
  VkDeviceSize offset_local;
  VkDevice device_local;
  DeviceInterface *vkd_local;
  VkDeviceMemory memory_local;
  
  local_58[0] = 6;
  range.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  range._4_4_ = 0;
  range.pNext = (void *)memory.m_internal;
  range.memory.m_internal = offset;
  range.offset = size;
  range.size = size;
  result = (*vkd->_vptr_DeviceInterface[9])(vkd,device,1,local_58);
  checkResult(result,"vkd.flushMappedMemoryRanges(device, 1u, &range)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkMemUtil.cpp"
              ,0xe0);
  return;
}

Assistant:

void flushMappedMemoryRange (const DeviceInterface& vkd, VkDevice device, VkDeviceMemory memory, VkDeviceSize offset, VkDeviceSize size)
{
	const VkMappedMemoryRange	range	=
	{
		VK_STRUCTURE_TYPE_MAPPED_MEMORY_RANGE,
		DE_NULL,
		memory,
		offset,
		size
	};

	VK_CHECK(vkd.flushMappedMemoryRanges(device, 1u, &range));
}